

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.c
# Opt level: O0

void make_filepath(char **out,char *dirname,char *filename)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char local_2d;
  char last_dirname_char;
  int res_len;
  char *_dirname;
  char *filename_local;
  char *dirname_local;
  char **out_local;
  
  if ((dirname == (char *)0x0) || (filename == (char *)0x0)) {
    *out = (char *)0x0;
  }
  else {
    __s = strdup(dirname);
    if (*__s == '\0') {
      *out = (char *)0x0;
    }
    else {
      sVar2 = strlen(dirname);
      sVar3 = strlen(filename);
      iVar1 = (int)sVar2 + (int)sVar3 + 2;
      pcVar4 = (char *)malloc((long)iVar1);
      *out = pcVar4;
      if (*out != (char *)0x0) {
        strcpy(*out,"");
        local_2d = '\0';
        sVar2 = strlen(__s);
        if (sVar2 != 0) {
          sVar2 = strlen(__s);
          local_2d = __s[sVar2 - 1];
        }
        if (local_2d == '/') {
          sVar2 = strlen(__s);
          __s[sVar2 - 1] = '\0';
        }
        snprintf(*out,(long)iVar1,"%s%s%s",__s,"/",filename);
        free(__s);
      }
    }
  }
  return;
}

Assistant:

void make_filepath(char **out, const char *dirname, const char *filename) {

    if (dirname == NULL || filename == NULL) {
        *out = NULL;
        return;
    }

    char *_dirname = strdup(dirname);
    if (*_dirname == NULL) {
        *out = NULL;
        return;
    }
    const int res_len = strlen(dirname) + strlen(filename) + 2;

    *out = malloc(res_len * sizeof(char));
    if (*out == NULL) {
        return;
    }
    strcpy(*out, "");

    char last_dirname_char = '\0';
    if (strlen(_dirname) > 0)
        last_dirname_char = _dirname[strlen(_dirname) - 1];

    if (last_dirname_char == *FILENAME_SEPARATOR)
        _dirname[strlen(_dirname) - 1] = '\0';

    snprintf(*out, res_len, "%s%s%s", _dirname, FILENAME_SEPARATOR, filename);

    free(_dirname);
}